

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

string * __thiscall
CFG::findNewUnusedVariableLetter_abi_cxx11_(string *__return_storage_ptr__,CFG *this)

{
  bool bVar1;
  char c;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  c = 'A';
  while( true ) {
    toString_abi_cxx11_(&local_68,c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,&this->nonTerminalsV);
    bVar1 = inVector(&local_68,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) break;
    c = c + '\x01';
  }
  toString_abi_cxx11_(__return_storage_ptr__,c);
  return __return_storage_ptr__;
}

Assistant:

std::string CFG::findNewUnusedVariableLetter() {
    char newVariable = 'A';
    while (inVector(toString(newVariable), nonTerminalsV)) { newVariable++; }
    return toString(newVariable);
}